

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  void *__buf;
  FILE *__n;
  exception *e;
  size_t len;
  undefined1 local_27b8 [7];
  bool done;
  uchar buf [10000];
  undefined1 local_90 [8];
  Pl_ASCIIHexDecoder decode;
  Pl_StdioFile out;
  
  Pl_StdioFile::Pl_StdioFile((Pl_StdioFile *)&decode.eod,"stdout",_stdout);
  Pl_ASCIIHexDecoder::Pl_ASCIIHexDecoder
            ((Pl_ASCIIHexDecoder *)local_90,"decode",(Pipeline *)&decode.eod);
  bVar1 = false;
  while (!bVar1) {
    __n = _stdin;
    __buf = (void *)fread(local_27b8,1,10000,_stdin);
    if (__buf == (void *)0x0) {
      bVar1 = true;
    }
    else {
      Pl_ASCIIHexDecoder::write((Pl_ASCIIHexDecoder *)local_90,(int)local_27b8,__buf,(size_t)__n);
    }
  }
  Pl_ASCIIHexDecoder::finish((Pl_ASCIIHexDecoder *)local_90);
  Pl_ASCIIHexDecoder::~Pl_ASCIIHexDecoder((Pl_ASCIIHexDecoder *)local_90);
  Pl_StdioFile::~Pl_StdioFile((Pl_StdioFile *)&decode.eod);
  return 0;
}

Assistant:

int
main()
{
    Pl_StdioFile out("stdout", stdout);
    Pl_ASCIIHexDecoder decode("decode", &out);

    try {
        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), stdin);
            if (len <= 0) {
                done = true;
            } else {
                decode.write(buf, len);
            }
        }
        decode.finish();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}